

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

void Imf_2_5::convertInPlace(char **writePtr,char **readPtr,PixelType type,size_t numPixels)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ArgExc *this;
  long lVar4;
  undefined2 local_12;
  undefined4 local_10;
  undefined4 local_c;
  
  if (type == UINT) {
    if (numPixels != 0) {
      sVar3 = 0;
      do {
        local_10 = *(undefined4 *)*readPtr;
        lVar4 = 0;
        do {
          cVar1 = *(char *)((long)&local_10 + lVar4);
          pcVar2 = *writePtr;
          *writePtr = pcVar2 + 1;
          *pcVar2 = cVar1;
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 4);
        *readPtr = *readPtr + 4;
        sVar3 = sVar3 + 1;
      } while (sVar3 != numPixels);
    }
  }
  else if (type == HALF) {
    if (numPixels != 0) {
      sVar3 = 0;
      do {
        local_12 = *(undefined2 *)*readPtr;
        lVar4 = 0;
        do {
          cVar1 = *(char *)((long)&local_12 + lVar4);
          pcVar2 = *writePtr;
          *writePtr = pcVar2 + 1;
          *pcVar2 = cVar1;
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 2);
        *readPtr = *readPtr + 2;
        sVar3 = sVar3 + 1;
      } while (sVar3 != numPixels);
    }
  }
  else {
    if (type != FLOAT) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
      __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    if (numPixels != 0) {
      sVar3 = 0;
      do {
        local_c = *(undefined4 *)*readPtr;
        lVar4 = 0;
        do {
          cVar1 = *(char *)((long)&local_c + lVar4);
          pcVar2 = *writePtr;
          *writePtr = pcVar2 + 1;
          *pcVar2 = cVar1;
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 4);
        *readPtr = *readPtr + 4;
        sVar3 = sVar3 + 1;
      } while (sVar3 != numPixels);
    }
  }
  return;
}

Assistant:

void
convertInPlace (char *& writePtr,
                const char *& readPtr,
		PixelType type,
                size_t numPixels)
{
    switch (type)
    {
      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
    
        for (size_t j = 0; j < numPixels; ++j)
        {
            Xdr::write <CharPtrIO> (writePtr, *(const unsigned int *) readPtr);
            readPtr += sizeof(unsigned int);
        }
        break;
    
      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
    
        for (size_t j = 0; j < numPixels; ++j)
        {               
            Xdr::write <CharPtrIO> (writePtr, *(const half *) readPtr);
            readPtr += sizeof(half);
        }
        break;
    
      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
    
        for (size_t j = 0; j < numPixels; ++j)
        {
            union bytesOrFloat tmp;
            tmp.b = * reinterpret_cast<const FBytes *>( readPtr );
            Xdr::write <CharPtrIO> (writePtr, tmp.f);
            readPtr += sizeof(float);
        }
        break;
    
      default:
    
        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
    }
}